

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O2

void pzgeom::TPZGeoPrism::GradX<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *pFVar1;
  int j;
  long row;
  int i;
  long col;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_4b0;
  TPZFNMatrix<6,_Fad<double>_> phi;
  TPZFNMatrix<18,_Fad<double>_> dphi;
  
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(gradx,3,3);
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xf])(gradx);
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix(&phi,6,1);
  TPZFNMatrix<18,_Fad<double>_>::TPZFNMatrix(&dphi,3,6);
  pztopology::TPZPrism::TShape<Fad<double>>
            (loc,&phi.super_TPZFMatrix<Fad<double>_>,&dphi.super_TPZFMatrix<Fad<double>_>);
  for (col = 0; col != 6; col = col + 1) {
    for (row = 0; row != 3; row = row + 1) {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      local_4b0.fadexpr_.right_ =
           TPZFMatrix<Fad<double>_>::operator()(&dphi.super_TPZFMatrix<Fad<double>_>,0,col);
      local_4b0.fadexpr_.left_.defaultVal = 0.0;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,row,0);
      Fad<double>::operator+=(pFVar1,&local_4b0);
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      local_4b0.fadexpr_.right_ =
           TPZFMatrix<Fad<double>_>::operator()(&dphi.super_TPZFMatrix<Fad<double>_>,1,col);
      local_4b0.fadexpr_.left_.defaultVal = 0.0;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,row,1);
      Fad<double>::operator+=(pFVar1,&local_4b0);
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      local_4b0.fadexpr_.right_ =
           TPZFMatrix<Fad<double>_>::operator()(&dphi.super_TPZFMatrix<Fad<double>_>,2,col);
      local_4b0.fadexpr_.left_.defaultVal = 0.0;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,row,2);
      Fad<double>::operator+=(pFVar1,&local_4b0);
    }
  }
  TPZFNMatrix<18,_Fad<double>_>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

inline void TPZGeoPrism::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 6){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x6." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        for(int i = 0; i < 6; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }